

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.hpp
# Opt level: O0

void __thiscall
mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_>::WriteRowDelNames
          (NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_> *this,
          string *namebase)

{
  function<void_(mp::StringFileWriter_&)> *in_stack_00000030;
  string *in_stack_00000038;
  NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_> *in_stack_00000040;
  anon_class_8_1_8991fb9c *__f;
  char *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  function<void_(mp::StringFileWriter_&)> local_50;
  anon_class_8_1_8991fb9c local_30 [6];
  
  __f = local_30;
  std::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  std::function<void(mp::StringFileWriter&)>::
  function<mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,mp::NLFeeder_Easy>>::WriteRowDelNames(std::__cxx11::string_const&)::_lambda(mp::StringFileWriter&)_1_,void>
            (&local_50,__f);
  WriteStringVec2File(in_stack_00000040,in_stack_00000038,in_stack_00000030);
  std::function<void_(mp::StringFileWriter_&)>::~function
            ((function<void_(mp::StringFileWriter_&)> *)0x134a0a);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void NLWriter2<Params>::WriteRowDelNames(
    const std::string& namebase) {
  WriteStringVec2File(namebase + ".slc",
                      [this](StringFileWriter& w){
    feeder_.FeedDelRowNames(w); });
}